

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RBTree.h
# Opt level: O0

RBTree<int> * __thiscall BinTrees::RBTree<int>::i<int_const&>(RBTree<int> *this,int *v)

{
  BinTree<int> **ppBVar1;
  runtime_error *this_00;
  BinTree<int> *pBVar2;
  RBTree<int> *pRVar3;
  RBTree<int> *pRVar4;
  RBTree<int> *pRVar5;
  BinSTree<int> *extraout_RAX;
  RBTree<int> *extraout_RAX_00;
  RBTree<int> *pRVar6;
  int iVar7;
  void *extraout_RDX;
  void *extraout_RDX_00;
  RBTree<int> *in_RSI;
  RBTree<int> *in_RDI;
  char *in_R8;
  int in_R9D;
  RBTree<int> *y;
  RBTree<int> *i;
  RBTree<int> *root;
  BinTree<int> **ip;
  BinTree<int> *xp;
  int in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  BinTree<int> *in_stack_ffffffffffffff70;
  BinSTree<int> *in_stack_ffffffffffffff78;
  RBTree<int> *in_stack_ffffffffffffff80;
  byte local_61;
  BinSTree<int> *pBVar8;
  RBTree<int> *local_28;
  
  ppBVar1 = BinSTree<int>::unsafe_search
                      (in_stack_ffffffffffffff78,&in_stack_ffffffffffffff70->v,
                       (BinTree<int> **)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (*ppBVar1 == (BinTree<int> *)0x0) {
    pBVar2 = (BinTree<int> *)operator_new(0x28);
    RBTree<int_const&>(in_stack_ffffffffffffff80,(int *)in_stack_ffffffffffffff78,
                       in_stack_ffffffffffffff70);
    *ppBVar1 = pBVar2;
    pRVar5 = (RBTree<int> *)*ppBVar1;
    local_28 = in_RDI;
    while( true ) {
      pRVar3 = p((RBTree<int> *)0x105917);
      local_61 = 0;
      pRVar4 = pRVar5;
      if (pRVar3 != (RBTree<int> *)0x0) {
        pRVar4 = p((RBTree<int> *)0x105930);
        local_61 = pRVar4->c;
        pRVar4 = pRVar5;
      }
      if ((local_61 & 1) == 0) break;
      pRVar5 = p((RBTree<int> *)0x10594e);
      p((RBTree<int> *)0x10595d);
      p((RBTree<int> *)0x105965);
      pRVar3 = l((RBTree<int> *)0x10596d);
      if (pRVar5 == pRVar3) {
        p((RBTree<int> *)0x105988);
        iVar7 = (int)pRVar3;
        pRVar5 = p((RBTree<int> *)0x105990);
        r(pRVar5,in_RSI,extraout_RDX,iVar7,in_R8,in_R9D,in_stack_ffffffffffffff68);
        if ((extraout_RAX == (BinSTree<int> *)0x0) ||
           ((extraout_RAX[1].super_BinTree<int>.v & 1) == 0)) {
          pBVar8 = extraout_RAX;
          pRVar5 = pRVar4;
          pRVar3 = p((RBTree<int> *)0x105a0d);
          r(pRVar3,in_RSI,extraout_RDX_00,iVar7,in_R8,in_R9D,in_stack_ffffffffffffff68);
          if (pRVar4 == extraout_RAX_00) {
            pRVar5 = p((RBTree<int> *)0x105a2c);
            BinSTree<int>::LR(&pRVar5->super_BinSTree<int>,pBVar8);
          }
          pRVar4 = p((RBTree<int> *)0x105a4f);
          pRVar4->c = false;
          p((RBTree<int> *)0x105a5d);
          pRVar4 = p((RBTree<int> *)0x105a65);
          pRVar4->c = true;
          p((RBTree<int> *)0x105a7d);
          in_RSI = p((RBTree<int> *)0x105a85);
          local_28 = (RBTree<int> *)BinSTree<int>::RR(&pRVar5->super_BinSTree<int>,pBVar8);
        }
        else {
          pBVar8 = extraout_RAX;
          pRVar5 = p((RBTree<int> *)0x1059ba);
          pRVar5->c = false;
          *(undefined1 *)&pBVar8[1].super_BinTree<int>.v = 0;
          p((RBTree<int> *)0x1059d1);
          pRVar5 = p((RBTree<int> *)0x1059d9);
          pRVar5->c = true;
          p((RBTree<int> *)0x1059e7);
          pRVar5 = p((RBTree<int> *)0x1059ef);
        }
      }
      else {
        p((RBTree<int> *)0x105aa6);
        p((RBTree<int> *)0x105aae);
        pRVar3 = l((RBTree<int> *)0x105ab6);
        if ((pRVar3 == (RBTree<int> *)0x0) || ((pRVar3->c & 1U) == 0)) {
          pRVar5 = pRVar4;
          p((RBTree<int> *)0x105b2b);
          pRVar6 = l((RBTree<int> *)0x105b33);
          if (pRVar4 == pRVar6) {
            pRVar5 = p((RBTree<int> *)0x105b4a);
            BinSTree<int>::RR(&pRVar5->super_BinSTree<int>,&pRVar3->super_BinSTree<int>);
          }
          pRVar4 = p((RBTree<int> *)0x105b6d);
          pRVar4->c = false;
          p((RBTree<int> *)0x105b7b);
          pRVar4 = p((RBTree<int> *)0x105b83);
          pRVar4->c = true;
          p((RBTree<int> *)0x105b9b);
          in_RSI = p((RBTree<int> *)0x105ba3);
          local_28 = (RBTree<int> *)
                     BinSTree<int>::LR(&pRVar5->super_BinSTree<int>,&pRVar3->super_BinSTree<int>);
        }
        else {
          pRVar5 = p((RBTree<int> *)0x105ad8);
          pRVar5->c = false;
          pRVar3->c = false;
          p((RBTree<int> *)0x105aef);
          pRVar5 = p((RBTree<int> *)0x105af7);
          pRVar5->c = true;
          p((RBTree<int> *)0x105b05);
          pRVar5 = p((RBTree<int> *)0x105b0d);
        }
      }
    }
    local_28->c = false;
    return local_28;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Repeated insert.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

RBTree<T> *RBTree<T>::i(F &&v) {
        BinTree<T> *xp = nullptr;
        BinTree<T> *&ip = this->unsafe_search(v, xp);
        auto root = this;
        if (ip) throw std::runtime_error("Repeated insert.");
        else {
            ip = new RBTree(std::forward<F>(v), xp);
        }
        auto i = static_cast<RBTree<T> *>(ip);
        RBTree<T> *y = nullptr;
        while (i->p() && i->p()->c) {
            if (i->p() == i->p()->p()->l()) {
                y = i->p()->p()->r();
                if (y && y->c) {
                    i->p()->c = false;
                    y->c = false;
                    i->p()->p()->c = true;
                    i = i->p()->p();
                } else {
                    if (i == i->p()->r()) {
                        i = i->p();
                        root = static_cast<RBTree<T> *>(root->LR(i));
                    }
                    i->p()->c = false;
                    i->p()->p()->c = true;
                    root = static_cast<RBTree<T> *>(root->RR(i->p()->p()));
                }
            } else {
                y = i->p()->p()->l();
                if (y && y->c) {
                    i->p()->c = false;
                    y->c = false;
                    i->p()->p()->c = true;
                    i = i->p()->p();
                } else {
                    if (i == i->p()->l()) {
                        i = i->p();
                        root = static_cast<RBTree<T> *>(root->RR(i));
                    }
                    i->p()->c = false;
                    i->p()->p()->c = true;
                    root = static_cast<RBTree<T> *>(root->LR(i->p()->p()));
                }
            }
        }
        root->c = false;

        return root;
    }